

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_writeclosure(HSQUIRRELVM v,SQWRITEFUNC w,SQUserPointer up)

{
  bool bVar1;
  long lVar2;
  SQVM *in_RDX;
  SQClosure *in_RSI;
  SQObjectPtr **in_RDI;
  SQInteger unaff_retaddr;
  HSQUIRRELVM in_stack_00000008;
  unsigned_short tag;
  SQObjectPtr *o;
  SQChar *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined2 uVar3;
  SQUserPointer up_00;
  undefined8 in_stack_fffffffffffffff8;
  SQRESULT SVar4;
  
  up_00 = (SQUserPointer)0x0;
  bVar1 = sq_aux_gettypedarg(in_stack_00000008,unaff_retaddr,
                             (SQObjectType)((ulong)in_stack_fffffffffffffff8 >> 0x20),in_RDI);
  if (bVar1) {
    uVar3 = 0xfafa;
    if (*(long *)(*(long *)(*(long *)((long)up_00 + 8) + 0x48) + 0xb8) == 0) {
      lVar2 = (*(code *)in_RSI)(in_RDX,&stack0xffffffffffffffd6,2);
      if (lVar2 == 2) {
        bVar1 = SQClosure::Save(in_RSI,in_RDX,up_00,
                                (SQWRITEFUNC)CONCAT26(uVar3,in_stack_ffffffffffffffd0));
        if (bVar1) {
          SVar4 = 0;
        }
        else {
          SVar4 = -1;
        }
      }
      else {
        SVar4 = sq_throwerror((HSQUIRRELVM)CONCAT26(uVar3,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffc8);
      }
    }
    else {
      SVar4 = sq_throwerror((HSQUIRRELVM)CONCAT26(0xfafa,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8);
    }
  }
  else {
    SVar4 = -1;
  }
  return SVar4;
}

Assistant:

SQRESULT sq_writeclosure(HSQUIRRELVM v,SQWRITEFUNC w,SQUserPointer up)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, -1, OT_CLOSURE,o);
    unsigned short tag = SQ_BYTECODE_STREAM_TAG;
    if(_closure(*o)->_function->_noutervalues)
        return sq_throwerror(v,_SC("a closure with free valiables bound it cannot be serialized"));
    if(w(up,&tag,2) != 2)
        return sq_throwerror(v,_SC("io error"));
    if(!_closure(*o)->Save(v,up,w))
        return SQ_ERROR;
    return SQ_OK;
}